

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

bool menu_bar_sub_item_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object cmd;
  Am_Value cmd_value;
  Am_Object main_item;
  Am_Object win;
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0xcc,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    if (!bVar1) {
      self_local._7_1_ = 0;
      goto LAB_0036290e;
    }
  }
  Am_Object::Am_Object(&main_item);
  pAVar2 = Am_Object::Get((Am_Object *)owner.data,0x68,0);
  Am_Object::operator=(&main_item,pAVar2);
  bVar1 = Am_Object::Valid(&main_item);
  if (bVar1) {
    Am_Object::Am_Object((Am_Object *)&cmd_value.value);
    pAVar2 = Am_Object::Get(&main_item,0x1d3,0);
    Am_Object::operator=((Am_Object *)&cmd_value.value,pAVar2);
    bVar1 = Am_Object::Valid((Am_Object *)&cmd_value.value);
    if (bVar1) {
      pAVar2 = Am_Object::Get((Am_Object *)&cmd_value.value,0xcc,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      if (bVar1) goto LAB_00362795;
      self_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
LAB_00362795:
      bVar1 = false;
    }
    Am_Object::~Am_Object((Am_Object *)&cmd_value.value);
    if (!bVar1) goto LAB_003627b4;
  }
  else {
LAB_003627b4:
    pAVar2 = Am_Object::Peek((Am_Object *)owner.data,0xc5,0);
    Am_Value::Am_Value((Am_Value *)&cmd,pAVar2);
    if ((short)cmd.data == -0x5fff) {
      Am_Object::Am_Object(&local_58,(Am_Value *)&cmd);
      Am_Object::Am_Object(&local_60,&Am_Command);
      bVar1 = Am_Object::Is_Instance_Of(&local_58,&local_60);
      Am_Object::~Am_Object(&local_60);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&local_58,0xcc,0);
        self_local._7_1_ = Am_Value::operator_cast_to_bool(pAVar2);
      }
      Am_Object::~Am_Object(&local_58);
      if (!bVar1) goto LAB_003628d7;
    }
    else {
LAB_003628d7:
      self_local._7_1_ = 1;
    }
    Am_Value::~Am_Value((Am_Value *)&cmd);
  }
  Am_Object::~Am_Object(&main_item);
LAB_0036290e:
  Am_Object::~Am_Object(&local_20);
  return (bool)(self_local._7_1_ & 1);
}

Assistant:

Am_Define_Formula(bool, menu_bar_sub_item_active)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && !(bool)owner.Get(Am_ACTIVE))
    return false;
  // now check the main-item I am attached to, if any
  Am_Object win;
  win = self.Get(Am_WINDOW);
  if (win.Valid()) {
    Am_Object main_item;
    main_item = win.Get(Am_FOR_ITEM);
    if (main_item.Valid() && !(bool)main_item.Get(Am_ACTIVE))
      return false;
  }
  //now check my command object, if any
  //   Am_Object cmd = self.GV_Object(Am_COMMAND);
  //   if( cmd.Valid() && cmd.Is_Instance_Of(Am_Command) )
  //     return cmd.GV(Am_ACTIVE);
  //   else
  //     return true;
  Am_Value cmd_value = self.Peek(Am_COMMAND);
  if (cmd_value.type == Am_OBJECT) {
    Am_Object cmd = cmd_value;
    if (cmd.Is_Instance_Of(Am_Command))
      return cmd.Get(Am_ACTIVE);
  }
  return true;
}